

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O2

void av1_gop_setup_structure(AV1_COMP *cpi)

{
  uint start;
  int *__s;
  _Bool *p_Var1;
  uint uVar2;
  AV1_PRIMARY *pAVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  FRAME_TYPE FVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  undefined8 unaff_RBP;
  ulong uVar15;
  int iVar16;
  int gf_index;
  int iVar17;
  int *first_frame_index;
  uint uVar18;
  int in_stack_ffffffffffffff98;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  undefined4 local_4c;
  ulong local_48;
  int parallel_frame_count;
  uint local_38;
  uint local_34;
  
  pAVar3 = cpi->ppi;
  if ((cpi->rc).frames_since_key == 0) {
    iVar7 = (cpi->oxcf).kf_max_pyr_height;
    if (iVar7 != -1) {
      iVar17 = (pAVar3->gf_group).max_layer_depth_allowed;
      if (iVar7 < iVar17) {
        iVar17 = iVar7;
      }
      (pAVar3->gf_group).max_layer_depth_allowed = iVar17;
    }
    uVar13 = 0;
  }
  else {
    uVar13 = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),(pAVar3->gf_state).arf_gf_boost_lst == 0)
             ^ 3;
  }
  uVar18 = (pAVar3->p_rc).baseline_gf_interval;
  local_5c = 0;
  local_54 = 0;
  cVar12 = (char)uVar13;
  if (cVar12 == '\0') {
    local_58 = 0;
  }
  else {
    local_58 = (cpi->common).current_frame.frame_number;
  }
  local_48 = CONCAT44(local_48._4_4_,local_58);
  __s = (pAVar3->gf_group).frame_parallel_level;
  memset((pAVar3->gf_group).src_offset,0,1000);
  memset(__s,0,0x5dc);
  memset((pAVar3->gf_group).skip_frame_refresh,0xff,9000);
  iVar7 = 2;
  uVar5 = 2;
  if (cVar12 == '\0') {
    bVar4 = 1 < (cpi->oxcf).kf_cfg.enable_keyframe_filtering;
    (pAVar3->gf_group).update_type[0] = (bVar4 && uVar18 != 0xfa) * '\x03';
    (pAVar3->gf_group).arf_src_offset[0] = '\0';
    (pAVar3->gf_group).cur_frame_idx[0] = '\0';
    (pAVar3->gf_group).layer_depth[0] = 0;
    (pAVar3->gf_group).frame_type[0] = '\0';
    (pAVar3->gf_group).refbuf_state[0] = '\0';
    (pAVar3->gf_group).max_layer_depth = 0;
    (pAVar3->gf_group).display_idx[0] = (uint)local_48;
    iVar7 = 1;
    local_50 = 1;
    uVar14 = local_50;
    if (bVar4 && uVar18 != 0xfa) {
      (pAVar3->gf_group).update_type[1] = '\x04';
      (pAVar3->gf_group).arf_src_offset[1] = '\0';
      (pAVar3->gf_group).cur_frame_idx[1] = '\0';
      (pAVar3->gf_group).layer_depth[1] = 0;
      (pAVar3->gf_group).frame_type[1] = '\x01';
      (pAVar3->gf_group).refbuf_state[1] = '\x01';
      (pAVar3->gf_group).display_idx[1] = (uint)local_48;
      uVar14 = uVar5;
    }
    local_48._0_4_ = (uint)local_48 + 1;
    local_54 = 1;
    local_4c = 0;
    local_5c = uVar14;
    local_58 = (uint)local_48;
  }
  else if (cVar12 == '\x02') {
    (pAVar3->gf_group).update_type[0] = '\x02';
    (pAVar3->gf_group).arf_src_offset[0] = '\0';
    (pAVar3->gf_group).cur_frame_idx[0] = '\0';
    (pAVar3->gf_group).layer_depth[0] = 0;
    (pAVar3->gf_group).frame_type[0] = '\x01';
    local_4c = 1;
    (pAVar3->gf_group).refbuf_state[0] = '\x01';
    (pAVar3->gf_group).max_layer_depth = 0;
    iVar7 = 1;
    (pAVar3->gf_group).display_idx[0] = (uint)local_48;
    local_48._0_4_ = (uint)local_48 + 1;
    uVar14 = 1;
    local_50 = uVar14;
    local_5c = uVar14;
    local_58 = (uint)local_48;
    local_54 = uVar14;
  }
  else {
    uVar14 = 0;
    local_4c = 0;
    local_50 = 0;
  }
  iVar17 = (pAVar3->gf_group).max_layer_depth_allowed;
  local_34 = (cpi->rc).frames_to_fwd_kf;
  uVar2 = (cpi->oxcf).kf_cfg.sframe_dist;
  iVar16 = (cpi->oxcf).kf_cfg.sframe_mode;
  if (0 < (int)uVar2 && 0 < iVar16) {
    if (iVar16 == 2) {
      p_Var1 = &(pAVar3->gf_group).is_sframe_due;
      *p_Var1 = (_Bool)(*p_Var1 | (uVar14 != 0 && uVar14 % uVar2 == 0));
    }
    else if (iVar16 == 1) {
      (pAVar3->gf_group).is_sframe_due = 0 < iVar17;
    }
  }
  start = uVar18 - 1;
  if (iVar17 < 1) {
    (pAVar3->gf_group).arf_index = -1;
  }
  else {
    (pAVar3->gf_group).update_type[uVar14] = '\x03';
    (pAVar3->gf_group).arf_src_offset[uVar14] = (char)start - (uchar)local_50;
    (pAVar3->gf_group).cur_frame_idx[uVar14] = (uchar)local_50;
    (pAVar3->gf_group).layer_depth[uVar14] = 1;
    (pAVar3->gf_group).arf_boost[uVar14] = (cpi->ppi->p_rc).gfu_boost;
    if (local_34 == start) {
      FVar10 = '\0';
    }
    else {
      FVar10 = (pAVar3->gf_group).is_sframe_due * '\x02' + '\x01';
    }
    (pAVar3->gf_group).frame_type[uVar14] = FVar10;
    (pAVar3->gf_group).is_sframe_due = (0 < (int)uVar2 && 0 < iVar16) && FVar10 != '\x03';
    (pAVar3->gf_group).refbuf_state[uVar14] = '\x01';
    (pAVar3->gf_group).max_layer_depth = 1;
    (pAVar3->gf_group).arf_index = uVar14;
    (pAVar3->gf_group).display_idx[uVar14] =
         (uint)local_48 + (pAVar3->gf_group).arf_src_offset[uVar14];
    local_5c = uVar14 + 1;
  }
  parallel_frame_count = 1;
  uVar14 = cpi->ppi->num_fp_contexts;
  local_48 = (ulong)start;
  local_38 = uVar13;
  if (((int)uVar14 < 2 || iVar17 < 1) || ((pAVar3->gf_group).max_layer_depth_allowed < 4)) {
    set_multi_layer_params
              (&pAVar3->twopass,&cpi->twopass_frame,&pAVar3->gf_group,&pAVar3->p_rc,
               (RATE_CONTROL *)&cpi->frame_info,(FRAME_INFO *)(ulong)local_50,start,(int)&local_54,
               (int *)&local_5c,&parallel_frame_count,(int *)(ulong)uVar14,0,(int)&local_50,
               (int *)&local_58,(int *)(ulong)((0 < iVar17) + 1),iVar7);
    if (iVar17 < 1) {
      uVar8 = (ulong)(int)local_5c;
      for (; (int)local_54 < (int)uVar18; local_54 = local_54 + 1) {
        (pAVar3->gf_group).update_type[uVar8] = '\x01';
        (pAVar3->gf_group).arf_src_offset[uVar8] = '\0';
        (pAVar3->gf_group).cur_frame_idx[uVar8] = (uchar)local_54;
        (pAVar3->gf_group).layer_depth[uVar8] = 6;
        (pAVar3->gf_group).arf_boost[uVar8] = 100;
        (pAVar3->gf_group).frame_type[uVar8] = '\x01';
        (pAVar3->gf_group).refbuf_state[uVar8] = '\x01';
        uVar13 = (pAVar3->gf_group).max_layer_depth;
        if ((int)uVar13 < 3) {
          uVar13 = uVar5;
        }
        (pAVar3->gf_group).max_layer_depth = uVar13;
        iVar7 = (pAVar3->gf_group).frame_parallel_level[uVar8];
        if (0 < iVar7) {
          if (iVar7 == 1) {
            local_50 = local_54;
          }
          (pAVar3->gf_group).src_offset[uVar8] =
               ((pAVar3->gf_group).arf_src_offset[uVar8] - local_50) + local_54;
        }
        (pAVar3->gf_group).display_idx[uVar8] = local_58;
        local_58 = local_58 + 1;
        uVar8 = uVar8 + 1;
      }
      goto LAB_0034ec3a;
    }
    bVar4 = false;
  }
  else {
    if ((char)local_4c != '\0') {
      uVar18 = start;
    }
    if (cVar12 == '\0') {
      uVar18 = start;
    }
    uVar13 = 0x7fffffff;
    if (uVar18 == 0x20) {
      uVar13 = 4;
    }
    first_frame_index = (int *)0x3;
    if (uVar18 != 0x10) {
      first_frame_index = (int *)(ulong)uVar13;
    }
    set_multi_layer_params_for_fp
              (&pAVar3->twopass,&cpi->twopass_frame,&pAVar3->gf_group,&pAVar3->p_rc,
               (RATE_CONTROL *)&cpi->frame_info,(FRAME_INFO *)(ulong)local_50,start,(int)&local_54,
               (int *)&local_5c,&parallel_frame_count,(int *)(ulong)uVar14,1,(int)&local_50,
               first_frame_index,(int)&local_58,(int *)0x2,in_stack_ffffffffffffff98);
    bVar4 = true;
  }
  lVar9 = (long)(int)local_5c;
  (pAVar3->gf_group).update_type[lVar9] = '\x04';
  (pAVar3->gf_group).arf_src_offset[lVar9] = '\0';
  (pAVar3->gf_group).cur_frame_idx[lVar9] = (uchar)local_54;
  (pAVar3->gf_group).layer_depth[lVar9] = 6;
  (pAVar3->gf_group).arf_boost[lVar9] = 100;
  (pAVar3->gf_group).frame_type[lVar9] = '\x01';
  (pAVar3->gf_group).refbuf_state[lVar9] = local_34 != start;
  (pAVar3->gf_group).display_idx[lVar9] = local_58;
  local_5c = local_5c + 1;
  uVar8 = (ulong)local_5c;
  if (bVar4) {
    uVar11 = 0;
    uVar15 = 0;
    if (0 < (int)local_5c) {
      uVar15 = (ulong)local_5c;
    }
    iVar7 = 0x7fffffff;
    iVar17 = 0;
    for (; uVar15 != uVar11; uVar11 = uVar11 + 1) {
      iVar16 = __s[uVar11];
      if (iVar16 == 1) {
        if ((iVar7 == 0x7fffffff) || (iVar17 != 0)) {
          iVar16 = 1;
        }
        else {
          __s[iVar7] = 0;
          iVar16 = __s[uVar11];
        }
        iVar17 = 0;
        iVar7 = (int)uVar11;
      }
      iVar17 = iVar17 + (uint)(iVar16 == 2);
    }
    if ((pAVar3->gf_group).frame_parallel_level[lVar9 + -1] == 1) {
      (pAVar3->gf_group).frame_parallel_level[lVar9 + -1] = 0;
    }
  }
LAB_0034ec3a:
  for (lVar9 = (long)(int)uVar8; lVar9 < 0xfa; lVar9 = lVar9 + 1) {
    (pAVar3->gf_group).update_type[lVar9] = '\x01';
    (pAVar3->gf_group).arf_src_offset[lVar9] = '\0';
    (pAVar3->gf_group).cur_frame_idx[lVar9] = (uchar)lVar9;
    (pAVar3->gf_group).layer_depth[lVar9] = 6;
    (pAVar3->gf_group).arf_boost[lVar9] = 100;
    (pAVar3->gf_group).frame_type[lVar9] = '\x01';
    (pAVar3->gf_group).refbuf_state[lVar9] = '\x01';
    uVar13 = (pAVar3->gf_group).max_layer_depth;
    if ((int)uVar13 < 3) {
      uVar13 = uVar5;
    }
    (pAVar3->gf_group).max_layer_depth = uVar13;
  }
  (pAVar3->gf_group).size = (int)uVar8;
  if ((pAVar3->gf_group).max_layer_depth_allowed == 0) {
    uVar13 = 0;
    do {
      uVar18 = uVar13;
      bVar6 = (byte)uVar18 & 0x1f;
      uVar13 = uVar18 + 1;
    } while (1 << bVar6 < (pAVar3->p_rc).baseline_gf_interval);
    for (uVar11 = (ulong)(uint)(0 << bVar6); (long)uVar11 < (long)(int)uVar8; uVar11 = uVar11 + 1) {
      iVar7 = 1;
      while ((iVar7 != 7 && (((uint)uVar11 >> (iVar7 - 1U & 0x1f) & 1) == 0))) {
        iVar7 = iVar7 + 1;
      }
      iVar7 = (uVar18 + 1) - iVar7;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      (pAVar3->gf_group).layer_depth[uVar11] = iVar7;
      uVar8 = (ulong)(uint)(pAVar3->gf_group).size;
    }
    uVar13 = 6;
    if (uVar18 < 6) {
      uVar13 = uVar18;
    }
    (pAVar3->gf_group).max_layer_depth = uVar13;
  }
  return;
}

Assistant:

void av1_gop_setup_structure(AV1_COMP *cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  const int key_frame = rc->frames_since_key == 0;
  FRAME_UPDATE_TYPE first_frame_update_type = ARF_UPDATE;

  if (key_frame) {
    first_frame_update_type = KF_UPDATE;
    if (cpi->oxcf.kf_max_pyr_height != -1) {
      gf_group->max_layer_depth_allowed = AOMMIN(
          cpi->oxcf.kf_max_pyr_height, gf_group->max_layer_depth_allowed);
    }
  } else if (!cpi->ppi->gf_state.arf_gf_boost_lst) {
    first_frame_update_type = GF_UPDATE;
  }

  gf_group->size = construct_multi_layer_gf_structure(
      cpi, twopass, gf_group, rc, frame_info, p_rc->baseline_gf_interval,
      first_frame_update_type);

  if (gf_group->max_layer_depth_allowed == 0)
    set_ld_layer_depth(gf_group, p_rc->baseline_gf_interval);
}